

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::ValidateProto3Field
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  string *psVar1;
  char *__rhs;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  bool bVar2;
  int iVar3;
  EnumDescriptor *pEVar4;
  long lVar5;
  string_view element_name;
  string_view element_name_00;
  string_view element_name_01;
  string_view element_name_02;
  string_view element_name_03;
  allocator<char> local_b9;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_b8;
  FieldDescriptor *field_local;
  VoidPtr local_a8;
  code *pcStack_a0;
  key_arg<std::basic_string_view<char>_> local_98;
  iterator local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
  local_48;
  
  field_local = field;
  if ((field->field_0x1 & 8) != 0) {
    psVar1 = field->containing_type_->all_names_;
    local_98._M_str = psVar1[1]._M_dataplus._M_p;
    local_98._M_len = psVar1[1]._M_string_length;
    if ((anonymous_namespace)::
        AllowedExtendeeInProto3(std::basic_string_view<char,std::char_traits<char>>)::
        allowed_proto3_extendees_abi_cxx11_ == '\0') {
      iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   AllowedExtendeeInProto3(std::basic_string_view<char,std::char_traits<char>>)
                                   ::allowed_proto3_extendees_abi_cxx11_);
      if (iVar3 != 0) {
        local_b8 = (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)operator_new(0x20);
        (local_b8->settings_).
        super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
        .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
        capacity_ = 0;
        (local_b8->settings_).
        super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
        .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.size_
             = 0;
        (local_b8->settings_).
        super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
        .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.
        heap_or_soo_.heap.control =
             (ctrl_t *)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>;
        absl::lts_20240722::container_internal::
        raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::reserve(local_b8,9);
        for (lVar5 = 0; lVar5 != 0x48; lVar5 = lVar5 + 8) {
          __rhs = *(char **)((long)&DAT_004ade40 + lVar5);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_68,"google.protobuf.",&local_b9);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_88,&local_68,__rhs);
          absl::lts_20240722::container_internal::
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::
          emplace<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_48,local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88)
          ;
          std::__cxx11::string::~string((string *)&local_88);
          std::__cxx11::string::~string((string *)&local_68);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_68,"proto2.",&local_b9);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_88,&local_68,__rhs);
          absl::lts_20240722::container_internal::
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::
          emplace<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&local_48,local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_88)
          ;
          std::__cxx11::string::~string((string *)&local_88);
          std::__cxx11::string::~string((string *)&local_68);
        }
        (anonymous_namespace)::
        AllowedExtendeeInProto3(std::basic_string_view<char,std::char_traits<char>>)::
        allowed_proto3_extendees_abi_cxx11_ =
             (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::__cxx11::string>>
              *)internal::
                OnShutdownDelete<absl::lts_20240722::flat_hash_set<std::__cxx11::string,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::__cxx11::string>>>
                          ((flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_b8);
        __cxa_guard_release(&(anonymous_namespace)::
                             AllowedExtendeeInProto3(std::basic_string_view<char,std::char_traits<char>>)
                             ::allowed_proto3_extendees_abi_cxx11_);
      }
    }
    local_88 = absl::lts_20240722::container_internal::
               raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::__cxx11::string>>
               ::find<std::basic_string_view<char,std::char_traits<char>>>
                         ((anonymous_namespace)::
                          AllowedExtendeeInProto3(std::basic_string_view<char,std::char_traits<char>>)
                          ::allowed_proto3_extendees_abi_cxx11_,&local_98);
    local_68._M_dataplus._M_p = (pointer)0x0;
    bVar2 = absl::lts_20240722::container_internal::operator!=(&local_88,(iterator *)&local_68);
    field = field_local;
    if (!bVar2) {
      element_name._M_str = field_local->all_names_[1]._M_dataplus._M_p;
      element_name._M_len = field_local->all_names_[1]._M_string_length;
      AddError(this,element_name,&proto->super_Message,EXTENDEE,
               "Extensions in proto3 are only allowed for defining options.");
    }
  }
  if ((field->merged_features_->field_0)._impl_.field_presence_ == 3) {
    element_name_00._M_str = field->all_names_[1]._M_dataplus._M_p;
    element_name_00._M_len = field->all_names_[1]._M_string_length;
    AddError(this,element_name_00,&proto->super_Message,TYPE,
             "Required fields are not allowed in proto3.");
  }
  if ((field->field_0x1 & 1) != 0) {
    element_name_01._M_str = field->all_names_[1]._M_dataplus._M_p;
    element_name_01._M_len = field->all_names_[1]._M_string_length;
    AddError(this,element_name_01,&proto->super_Message,DEFAULT_VALUE,
             "Explicit default values are not allowed in proto3.");
  }
  if (field->type_ == '\x0e') {
    pEVar4 = FieldDescriptor::enum_type(field);
    if (pEVar4 != (EnumDescriptor *)0x0) {
      pEVar4 = FieldDescriptor::enum_type(field);
      if ((pEVar4->merged_features_->field_0)._impl_.enum_type_ == 2) {
        local_a8.obj = &local_88;
        local_88.ctrl_ = (ctrl_t *)&field_local;
        pcStack_a0 = absl::lts_20240722::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::ValidateProto3Field(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptorProto_const&)::__0,std::__cxx11::string>
        ;
        make_error.invoker_ =
             absl::lts_20240722::functional_internal::
             InvokeObject<google::protobuf::DescriptorBuilder::ValidateProto3Field(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptorProto_const&)::__0,std::__cxx11::string>
        ;
        make_error.ptr_.obj = local_a8.obj;
        element_name_02._M_str = field->all_names_[1]._M_dataplus._M_p;
        element_name_02._M_len = field->all_names_[1]._M_string_length;
        AddError(this,element_name_02,&proto->super_Message,TYPE,make_error);
        field = field_local;
      }
    }
  }
  if (field->type_ == '\n') {
    element_name_03._M_str = field->all_names_[1]._M_dataplus._M_p;
    element_name_03._M_len = field->all_names_[1]._M_string_length;
    AddError(this,element_name_03,&proto->super_Message,TYPE,
             "Groups are not supported in proto3 syntax.");
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateProto3Field(const FieldDescriptor* field,
                                            const FieldDescriptorProto& proto) {
  if (field->is_extension() &&
      !AllowedExtendeeInProto3(field->containing_type()->full_name())) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::EXTENDEE,
             "Extensions in proto3 are only allowed for defining options.");
  }
  if (field->is_required()) {
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "Required fields are not allowed in proto3.");
  }
  if (field->has_default_value()) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::DEFAULT_VALUE,
             "Explicit default values are not allowed in proto3.");
  }
  if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM &&
      field->enum_type() && field->enum_type()->is_closed()) {
    // Proto3 messages can only use open enum types; otherwise we can't
    // guarantee that the default value is zero.
    AddError(
        field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE, [&] {
          return absl::StrCat("Enum type \"", field->enum_type()->full_name(),
                              "\" is not an open enum, but is used in \"",
                              field->containing_type()->full_name(),
                              "\" which is a proto3 message type.");
        });
  }
  if (field->type() == FieldDescriptor::TYPE_GROUP) {
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "Groups are not supported in proto3 syntax.");
  }
}